

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

bool __thiscall rlist::listInsertNode(rlist *this,void *node,unsigned_long pos)

{
  unsigned_long uVar1;
  uint local_34;
  uint i;
  unsigned_long tmp;
  unsigned_long pos_local;
  void *node_local;
  rlist *this_local;
  
  uVar1 = listLength(this);
  if (pos < uVar1) {
    this->view = this->rl->head;
    for (local_34 = 1; local_34 != pos; local_34 = local_34 + 1) {
      this->view = this->view->next;
    }
    *(listNode **)((long)node + 8) = this->view->next;
    *(listNode **)node = this->view;
    this->view->next->prev = (listNode *)node;
    this->view->next = (listNode *)node;
    this_local._7_1_ = true;
  }
  else if (uVar1 == pos) {
    this_local._7_1_ = listAppend(this,node);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool rlist::listInsertNode(void *node,unsigned long pos){
    unsigned long tmp=rlist::listLength();
    if(tmp>pos){
        view=rl->head;
        for(unsigned int i=1;i!=pos;i++)
            view=view->next;
        ((listNode *)node)->next=view->next;
        ((listNode *)node)->prev=view;
        view->next->prev=(listNode *)node;
        view->next=(listNode *)node; 
        return true;
    }else if(tmp==pos)
        return rlist::listAppend(node);
    else 
        return false;
}